

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pump.cpp
# Opt level: O3

bool __thiscall
Pump::changeSetting(Pump *this,double s,bool makeChange,string *reason,ostream *msgLog)

{
  int iVar1;
  
  if ((this->speed != s) || (NAN(this->speed) || NAN(s))) {
    if ((s != 0.0) || ((NAN(s) || ((this->super_Link).status != 0)))) {
      if (!makeChange) {
        return true;
      }
      if ((s != 0.0) || (NAN(s))) {
        iVar1 = 1;
      }
      else {
        (this->super_Link).flow = 1e-06;
        iVar1 = 0;
      }
      (this->super_Link).status = iVar1;
      this->speed = s;
      std::__ostream_insert<char,std::char_traits<char>>(msgLog,"\n    ",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (msgLog,(reason->_M_dataplus)._M_p,reason->_M_string_length);
      return true;
    }
    this->speed = s;
  }
  return false;
}

Assistant:

bool Pump::changeSetting(double s, bool makeChange, const string reason, ostream& msgLog)
{
    if ( speed != s )
    {
        if ( status == Link::LINK_CLOSED && s == 0.0 )
        {
            speed = s;
            return false;
        }

        if ( makeChange )
        {
            if ( s == 0.0 )
            {
                status = Link::LINK_CLOSED;
                flow = ZERO_FLOW;
            }
            else status = Link::LINK_OPEN;
            speed = s;
            msgLog << "\n    " << reason;
        }
        return true;
    }
    return false;
}